

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

int archive_write_mtree_close(archive_write *a)

{
  att_counter_set *top;
  attr_counter **top_00;
  attr_counter **top_01;
  attr_counter **top_02;
  uint uVar1;
  mtree_writer *mtree;
  int iVar2;
  mtree_entry_conflict *pmVar3;
  attr_counter *paVar4;
  mtree_entry_conflict *me;
  attr_counter **ppaVar5;
  attr_counter *paVar6;
  attr_counter *ac;
  mtree_entry_conflict **ppmVar7;
  mtree_entry_conflict *e;
  
  mtree = (mtree_writer *)a->format_data;
  me = mtree->root;
  if (me != (mtree_entry_conflict *)0x0) {
    top = &mtree->acs;
    top_00 = &(mtree->acs).gid_list;
    top_01 = &(mtree->acs).mode_list;
    top_02 = &(mtree->acs).flags_list;
    do {
      if (mtree->output_global_set != 0) {
        attr_counter_set_free(mtree);
        for (pmVar3 = (mtree_entry_conflict *)
                      __archive_rb_tree_iterate(&me->dir_info->rbtree,(archive_rb_node *)0x0,0);
            pmVar3 != (mtree_entry_conflict *)0x0;
            pmVar3 = (mtree_entry_conflict *)
                     __archive_rb_tree_iterate(&me->dir_info->rbtree,&pmVar3->rbnode,1)) {
          uVar1 = mtree->keys;
          if ((uVar1 & 0x300000) != 0) {
            paVar4 = top->uid_list;
            if (paVar4 == (attr_counter *)0x0) {
              paVar4 = (attr_counter *)malloc(0x20);
              if (paVar4 == (attr_counter *)0x0) {
                top->uid_list = (attr_counter *)0x0;
                goto LAB_0044f8b6;
              }
              paVar4->prev = (attr_counter *)0x0;
              paVar4->next = (attr_counter *)0x0;
              paVar4->count = 1;
              paVar4->m_entry = pmVar3;
              top->uid_list = paVar4;
            }
            else {
              if (paVar4->m_entry->uid == pmVar3->uid) {
                paVar6 = (attr_counter *)0x0;
              }
              else {
                do {
                  paVar6 = paVar4;
                  paVar4 = paVar6->next;
                  if (paVar4 == (attr_counter *)0x0) break;
                } while (paVar4->m_entry->uid != pmVar3->uid);
              }
              iVar2 = attr_counter_inc(&top->uid_list,paVar4,paVar6,pmVar3);
              if (iVar2 < 0) goto LAB_0044f8b6;
            }
          }
          if ((uVar1 & 0x30) != 0) {
            paVar4 = *top_00;
            if (paVar4 != (attr_counter *)0x0) {
              if (paVar4->m_entry->gid == pmVar3->gid) {
                paVar6 = (attr_counter *)0x0;
              }
              else {
                do {
                  paVar6 = paVar4;
                  paVar4 = paVar6->next;
                  if (paVar4 == (attr_counter *)0x0) break;
                } while (paVar4->m_entry->gid != pmVar3->gid);
              }
              iVar2 = attr_counter_inc(top_00,paVar4,paVar6,pmVar3);
              if (iVar2 < 0) goto LAB_0044f8b6;
              goto LAB_0044f5c8;
            }
            paVar4 = (attr_counter *)malloc(0x20);
            ppaVar5 = top_00;
            if (paVar4 != (attr_counter *)0x0) {
              paVar4->prev = (attr_counter *)0x0;
              paVar4->next = (attr_counter *)0x0;
              paVar4->count = 1;
              paVar4->m_entry = pmVar3;
              *top_00 = paVar4;
              goto LAB_0044f5c8;
            }
LAB_0044f8ad:
            *ppaVar5 = (attr_counter *)0x0;
            goto LAB_0044f8b6;
          }
LAB_0044f5c8:
          if ((uVar1 >> 9 & 1) != 0) {
            paVar4 = *top_01;
            if (paVar4 == (attr_counter *)0x0) {
              paVar4 = (attr_counter *)malloc(0x20);
              ppaVar5 = top_01;
              if (paVar4 == (attr_counter *)0x0) goto LAB_0044f8ad;
              paVar4->prev = (attr_counter *)0x0;
              paVar4->next = (attr_counter *)0x0;
              paVar4->count = 1;
              paVar4->m_entry = pmVar3;
              *top_01 = paVar4;
            }
            else {
              if (paVar4->m_entry->mode == pmVar3->mode) {
                paVar6 = (attr_counter *)0x0;
              }
              else {
                do {
                  paVar6 = paVar4;
                  paVar4 = paVar6->next;
                  if (paVar4 == (attr_counter *)0x0) break;
                } while (paVar4->m_entry->mode != pmVar3->mode);
              }
              iVar2 = attr_counter_inc(top_01,paVar4,paVar6,pmVar3);
              if (iVar2 < 0) goto LAB_0044f8b6;
            }
          }
          if ((uVar1 & 8) != 0) {
            if (*top_02 == (attr_counter *)0x0) {
              paVar4 = (attr_counter *)malloc(0x20);
              if (paVar4 == (attr_counter *)0x0) {
                *top_02 = (attr_counter *)0x0;
                goto LAB_0044f8b6;
              }
              paVar4->prev = (attr_counter *)0x0;
              paVar4->next = (attr_counter *)0x0;
              paVar4->count = 1;
              paVar4->m_entry = pmVar3;
              *top_02 = paVar4;
            }
            else {
              paVar4 = (attr_counter *)0x0;
              paVar6 = *top_02;
              do {
                if ((paVar6->m_entry->fflags_set == pmVar3->fflags_set) &&
                   (ac = paVar6, paVar6->m_entry->fflags_clear == pmVar3->fflags_clear)) break;
                ac = paVar6->next;
                paVar4 = paVar6;
                paVar6 = ac;
              } while (ac != (attr_counter *)0x0);
              iVar2 = attr_counter_inc(top_02,ac,paVar4,pmVar3);
              if (iVar2 < 0) {
LAB_0044f8b6:
                archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
                return -0x1e;
              }
            }
          }
        }
      }
      if ((me->dir_info->virtual == 0) || (mtree->classic != 0)) {
        iVar2 = write_mtree_entry(a,me);
        if (iVar2 != 0) {
          return -0x1e;
        }
      }
      else if (mtree->output_global_set != 0) {
        write_global(mtree);
      }
      mtree->depth = mtree->depth + 1;
      for (pmVar3 = (mtree_entry_conflict *)
                    __archive_rb_tree_iterate(&me->dir_info->rbtree,(archive_rb_node *)0x0,0);
          pmVar3 != (mtree_entry_conflict *)0x0;
          pmVar3 = (mtree_entry_conflict *)
                   __archive_rb_tree_iterate(&me->dir_info->rbtree,&pmVar3->rbnode,1)) {
        if (pmVar3->dir_info == (dir_info *)0x0) {
          iVar2 = write_mtree_entry(a,pmVar3);
          if (iVar2 != 0) {
            return -0x1e;
          }
        }
        else {
          pmVar3->dir_info->chnext = (mtree_entry_conflict *)0x0;
          *(me->dir_info->children).last = pmVar3;
          (me->dir_info->children).last = &pmVar3->dir_info->chnext;
        }
      }
      iVar2 = mtree->depth;
      mtree->depth = iVar2 + -1;
      pmVar3 = (me->dir_info->children).first;
      if (pmVar3 == (mtree_entry_conflict *)0x0) {
        if ((mtree->classic != 0) && (iVar2 = write_dot_dot_entry(a,me), iVar2 != 0)) {
          return -0x1e;
        }
        pmVar3 = me->parent;
        if (me != pmVar3) {
          do {
            ppmVar7 = &me->parent;
            me = me->dir_info->chnext;
            if (me != (mtree_entry_conflict *)0x0) break;
            if (mtree->indent != 0) {
              mtree->depth = mtree->depth + -1;
            }
            if ((mtree->classic != 0) && (iVar2 = write_dot_dot_entry(a,pmVar3), iVar2 != 0)) {
              return -0x1e;
            }
            me = *ppmVar7;
            pmVar3 = me->parent;
          } while (me != pmVar3);
        }
      }
      else {
        me = pmVar3;
        if (mtree->indent != 0) {
          mtree->depth = iVar2;
        }
      }
    } while (me != me->parent);
  }
  archive_write_set_bytes_in_last_block(&a->archive,1);
  iVar2 = __archive_write_output(a,(mtree->buf).s,(mtree->buf).length);
  return iVar2;
}

Assistant:

static int
archive_write_mtree_close(struct archive_write *a)
{
	struct mtree_writer *mtree= a->format_data;
	int ret;

	if (mtree->root != NULL) {
		ret = write_mtree_entry_tree(a);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	archive_write_set_bytes_in_last_block(&a->archive, 1);

	return __archive_write_output(a, mtree->buf.s, mtree->buf.length);
}